

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

void __thiscall CaDiCaL::Internal::section(Internal *this,char *title)

{
  long lVar1;
  Internal *pIVar2;
  size_t sVar3;
  size_t sVar4;
  int iVar5;
  
  if ((this->opts).quiet == 0) {
    lVar1 = (this->stats).sections;
    (this->stats).sections = lVar1 + 1;
    if ((lVar1 != 0) && (this->internal != (Internal *)0x0)) {
      message(this->internal);
    }
    fputs((this->prefix)._M_dataplus._M_p,_stdout);
    Terminal::color((Terminal *)tout,0x22,false);
    fputs("--- [ ",_stdout);
    Terminal::color((Terminal *)tout,0x22,true);
    fputs(title,_stdout);
    Terminal::color((Terminal *)tout,0x22,false);
    fputs(" ] ",_stdout);
    sVar3 = strlen(title);
    sVar4 = strlen((this->prefix)._M_dataplus._M_p);
    if ((int)sVar4 + (int)sVar3 + 9 < 0x4e) {
      iVar5 = (int)sVar4 + (int)sVar3 + -0x45;
      do {
        fputc(0x2d,_stdout);
        iVar5 = iVar5 + 1;
      } while (iVar5 != 0);
    }
    Terminal::code((Terminal *)tout,"0m");
    fputc(10,_stdout);
    pIVar2 = this->internal;
    if (pIVar2 != (Internal *)0x0) {
      if ((pIVar2->opts).quiet != 0) {
        return;
      }
      fputs((pIVar2->prefix)._M_dataplus._M_p,_stdout);
      fputc(10,_stdout);
      fflush(_stdout);
      return;
    }
  }
  return;
}

Assistant:

void Internal::section (const char *title) {
#ifdef LOGGING
  if (!opts.log)
#endif
    if (opts.quiet)
      return;
  if (stats.sections++)
    MSG ();
  print_prefix ();
  tout.blue ();
  fputs ("--- [ ", stdout);
  tout.blue (true);
  fputs (title, stdout);
  tout.blue ();
  fputs (" ] ", stdout);
  for (int i = strlen (title) + strlen (prefix.c_str ()) + 9; i < 78; i++)
    fputc ('-', stdout);
  tout.normal ();
  fputc ('\n', stdout);
  MSG ();
}